

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::ExceptionDetails>::construct
          (BasicTypeInfo<dap::ExceptionDetails> *this,void *ptr)

{
  memset((void *)((long)ptr + 0x10),0,0xd8);
  *(void **)ptr = (void *)((long)ptr + 0x10);
  *(undefined8 *)((long)ptr + 8) = 0;
  *(undefined1 *)((long)ptr + 0x20) = 0;
  *(long *)((long)ptr + 0x28) = (long)ptr + 0x38;
  *(undefined1 *)((long)ptr + 0x38) = 0;
  *(undefined8 *)((long)ptr + 0x50) = 0;
  *(undefined8 *)((long)ptr + 0x58) = 0;
  *(undefined8 *)((long)ptr + 0x59) = 0;
  *(undefined8 *)((long)ptr + 0x61) = 0;
  *(long *)((long)ptr + 0x70) = (long)ptr + 0x80;
  *(undefined1 *)((long)ptr + 0x80) = 0;
  *(long *)((long)ptr + 0x98) = (long)ptr + 0xa8;
  *(undefined1 *)((long)ptr + 0xa8) = 0;
  *(long *)((long)ptr + 0xc0) = (long)ptr + 0xd0;
  *(undefined1 *)((long)ptr + 0xd0) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }